

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMDocumentImpl::callUserDataHandlers
          (DOMDocumentImpl *this,DOMNodeImpl *n,DOMOperationType operation,DOMNode *src,DOMNode *dst
          )

{
  uint id;
  bool bVar1;
  uint *puVar2;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *this_00;
  DOMUserDataHandler *pDVar3;
  void *pvVar4;
  XMLCh *pXVar5;
  XMLCh *userKey;
  void *data;
  DOMUserDataHandler *handler;
  DOMUserDataRecord *userDataRecord;
  undefined1 local_d0 [4];
  int key2_1;
  ValueVectorEnumerator<int> snapshotEnum;
  int key2;
  void *key;
  ValueVectorOf<int> snapshot;
  undefined1 local_68 [8];
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  userDataEnum;
  DOMNode *dst_local;
  DOMNode *src_local;
  DOMOperationType operation_local;
  DOMNodeImpl *n_local;
  DOMDocumentImpl *this_local;
  
  if (this->fUserDataTable !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    userDataEnum.fLockPrimaryKey = dst;
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                *)local_68,this->fUserDataTable,false,this->fMemoryManager);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::setPrimaryKey((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                     *)local_68,n);
    ValueVectorOf<int>::ValueVectorOf((ValueVectorOf<int> *)&key,3,this->fMemoryManager,false);
    while (bVar1 = RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                   ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                                      *)local_68), bVar1) {
      RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::nextElementKey((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                        *)local_68,(void **)&stack0xffffffffffffff58,
                       (int *)((long)&snapshotEnum.fToEnum + 4));
      ValueVectorOf<int>::addElement
                ((ValueVectorOf<int> *)&key,(int *)((long)&snapshotEnum.fToEnum + 4));
    }
    ValueVectorEnumerator<int>::ValueVectorEnumerator
              ((ValueVectorEnumerator<int> *)local_d0,(ValueVectorOf<int> *)&key,false);
    while (bVar1 = ValueVectorEnumerator<int>::hasMoreElements
                             ((ValueVectorEnumerator<int> *)local_d0), bVar1) {
      puVar2 = (uint *)ValueVectorEnumerator<int>::nextElement
                                 ((ValueVectorEnumerator<int> *)local_d0);
      id = *puVar2;
      this_00 = RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                ::get(this->fUserDataTable,n,id);
      pDVar3 = KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>::getValue(this_00);
      if (pDVar3 != (DOMUserDataHandler *)0x0) {
        pvVar4 = KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>::getKey(this_00);
        pXVar5 = XMLStringPool::getValueForId(&this->fUserDataTableKeys,id);
        (**(code **)(*(long *)pDVar3 + 0x10))
                  (pDVar3,operation,pXVar5,pvVar4,src,userDataEnum.fLockPrimaryKey);
      }
    }
    if (operation == NODE_DELETED) {
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(this->fUserDataTable,n);
    }
    ValueVectorEnumerator<int>::~ValueVectorEnumerator((ValueVectorEnumerator<int> *)local_d0);
    ValueVectorOf<int>::~ValueVectorOf((ValueVectorOf<int> *)&key);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                *)local_68);
  }
  return;
}

Assistant:

void DOMDocumentImpl::callUserDataHandlers(const DOMNodeImpl* n, DOMUserDataHandler::DOMOperationType operation, const DOMNode* src, DOMNode* dst) const
{
    if (fUserDataTable) {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> userDataEnum(fUserDataTable, false, fMemoryManager);
        userDataEnum.setPrimaryKey(n);
        // Create a snapshot of the handlers to be called, as the "handle" callback could be invalidating the enumerator by calling
        // setUserData on the dst node
        ValueVectorOf< int > snapshot(3, fMemoryManager);
        while (userDataEnum.hasMoreElements()) {
            // get the key
            void* key;
            int key2;
            userDataEnum.nextElementKey(key,key2);
            snapshot.addElement(key2);
        }
        ValueVectorEnumerator< int > snapshotEnum(&snapshot);
        while(snapshotEnum.hasMoreElements())
        {
            int key2=snapshotEnum.nextElement();

            // get the DOMUserDataRecord
            DOMUserDataRecord* userDataRecord = fUserDataTable->get((void*)n,key2);

            // get the handler
            DOMUserDataHandler* handler = userDataRecord->getValue();

            if (handler) {
                // get the data
                void* data = userDataRecord->getKey();
                const XMLCh* userKey = fUserDataTableKeys.getValueForId(key2);
                handler->handle(operation, userKey, data, src, dst);
            }
        }
        // if the operation is NODE_DELETED, we in fact should remove the data from the table
        if (operation == DOMUserDataHandler::NODE_DELETED)
            fUserDataTable->removeKey((void*)n);
    }
}